

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
ObjectTest_basic_assignment_operator_unordered_set_Test::TestBody
          (ObjectTest_basic_assignment_operator_unordered_set_Test *this)

{
  __node_base_ptr *pp_Var1;
  __node_base_ptr *pp_Var2;
  char *pcVar3;
  pointer *__ptr;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  object obj;
  AssertHelper local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  _Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_128;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_e0;
  __node_base local_d8;
  size_type sStack_d0;
  _Prime_rehash_policy local_c8;
  __node_base_ptr local_b8 [2];
  _Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a8;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_68;
  char local_38;
  
  local_68._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_38 = '\0';
  pp_Var1 = &local_128._M_single_bucket;
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<bool,true,false>,std::__detail::_Node_iterator<bool,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<bool,_true,_false> *)local_e8,
             (_Node_iterator<bool,_true,_false> *)&local_a8);
  std::
  _Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,"obj .has< std::unordered_set<bool> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x305,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_std::unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_nullptr>
            ((unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> *)
             &local_128,(object *)&local_68._M_first,
             (unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> *)
             local_e8);
  pp_Var2 = &local_a8._M_single_bucket;
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<bool,std::hash<bool>,std::equal_to<bool>,std::allocator<bool>>,std::unordered_set<bool,std::hash<bool>,std::equal_to<bool>,std::allocator<bool>>>
            ((internal *)local_138,"obj .get< std::unordered_set<bool> >()",
             "std::unordered_set<bool> {}",
             (unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> *)
             &local_128,
             (unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> *)
             &local_a8);
  std::
  _Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a8);
  std::
  _Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_128);
  std::
  _Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x305,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<signed_char,true,false>,std::__detail::_Node_iterator<signed_char,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<signed_char,_true,_false> *)local_e8,
             (_Node_iterator<signed_char,_true,_false> *)&local_a8);
  std::
  _Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,
               "obj .has< std::unordered_set<signed char> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x306,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_std::unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            ((unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
              *)&local_128,(object *)&local_68._M_first,
             (unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
              *)local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>,std::unordered_set<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>>
            ((internal *)local_138,"obj .get< std::unordered_set<signed char> >()",
             "std::unordered_set<signed char> {}",
             (unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
              *)&local_128,
             (unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
              *)&local_a8);
  std::
  _Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x306,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<unsigned_char,true,false>,std::__detail::_Node_iterator<unsigned_char,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<unsigned_char,_true,_false> *)local_e8,
             (_Node_iterator<unsigned_char,_true,_false> *)&local_a8);
  std::
  _Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,
               "obj .has< std::unordered_set<unsigned char> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x307,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_std::unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            ((unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&local_128,(object *)&local_68._M_first,
             (unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              *)local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<unsigned_char,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<unsigned_char>>,std::unordered_set<unsigned_char,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<unsigned_char>>>
            ((internal *)local_138,"obj .get< std::unordered_set<unsigned char> >()",
             "std::unordered_set<unsigned char> {}",
             (unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&local_128,
             (unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&local_a8);
  std::
  _Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x307,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<short,true,false>,std::__detail::_Node_iterator<short,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<short,_true,_false> *)local_e8,
             (_Node_iterator<short,_true,_false> *)&local_a8);
  std::
  _Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,"obj .has< std::unordered_set<short> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x308,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_std::unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_nullptr>
            ((unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *
             )&local_128,(object *)&local_68._M_first,
             (unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *
             )local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<short,std::hash<short>,std::equal_to<short>,std::allocator<short>>,std::unordered_set<short,std::hash<short>,std::equal_to<short>,std::allocator<short>>>
            ((internal *)local_138,"obj .get< std::unordered_set<short> >()",
             "std::unordered_set<short> {}",
             (unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *
             )&local_128,
             (unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *
             )&local_a8);
  std::
  _Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x308,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<int,true,false>,std::__detail::_Node_iterator<int,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<int,_true,_false> *)local_e8,
             (_Node_iterator<int,_true,_false> *)&local_a8);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,"obj .has< std::unordered_set<int> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x309,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_nullptr>
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &local_128,(object *)&local_68._M_first,
             (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>,std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>
            ((internal *)local_138,"obj .get< std::unordered_set<int> >()",
             "std::unordered_set<int> {}",
             (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &local_128,
             (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &local_a8);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x309,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<long,true,false>,std::__detail::_Node_iterator<long,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<long,_true,_false> *)local_e8,
             (_Node_iterator<long,_true,_false> *)&local_a8);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,"obj .has< std::unordered_set<long> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30a,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            ((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             &local_128,(object *)&local_68._M_first,
             (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
            ((internal *)local_138,"obj .get< std::unordered_set<long> >()",
             "std::unordered_set<long> {}",
             (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             &local_128,
             (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             &local_a8);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<long_long,true,false>,std::__detail::_Node_iterator<long_long,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<long_long,_true,_false> *)local_e8,
             (_Node_iterator<long_long,_true,_false> *)&local_a8);
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,"obj .has< std::unordered_set<long long> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30b,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_nullptr>
            ((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              *)&local_128,(object *)&local_68._M_first,
             (unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              *)local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<long_long,std::hash<long_long>,std::equal_to<long_long>,std::allocator<long_long>>,std::unordered_set<long_long,std::hash<long_long>,std::equal_to<long_long>,std::allocator<long_long>>>
            ((internal *)local_138,"obj .get< std::unordered_set<long long> >()",
             "std::unordered_set<long long> {}",
             (unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              *)&local_128,
             (unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              *)&local_a8);
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<long,true,false>,std::__detail::_Node_iterator<long,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<long,_true,_false> *)local_e8,
             (_Node_iterator<long,_true,_false> *)&local_a8);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,"obj .has< std::unordered_set<intmax_t> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30c,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            ((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             &local_128,(object *)&local_68._M_first,
             (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
            ((internal *)local_138,"obj .get< std::unordered_set<intmax_t> >()",
             "std::unordered_set<intmax_t> {}",
             (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             &local_128,
             (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             &local_a8);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<float,true,false>,std::__detail::_Node_iterator<float,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<float,_true,_false> *)local_e8,
             (_Node_iterator<float,_true,_false> *)&local_a8);
  std::
  _Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,"obj .has< std::unordered_set<float> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30d,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_std::unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_nullptr>
            ((unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_> *
             )&local_128,(object *)&local_68._M_first,
             (unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_> *
             )local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<float,std::hash<float>,std::equal_to<float>,std::allocator<float>>,std::unordered_set<float,std::hash<float>,std::equal_to<float>,std::allocator<float>>>
            ((internal *)local_138,"obj .get< std::unordered_set<float> >()",
             "std::unordered_set<float> {}",
             (unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_> *
             )&local_128,
             (unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_> *
             )&local_a8);
  std::
  _Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<double,true,false>,std::__detail::_Node_iterator<double,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<double,_true,_false> *)local_e8,
             (_Node_iterator<double,_true,_false> *)&local_a8);
  std::
  _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,"obj .has< std::unordered_set<double> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30e,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_nullptr>
            ((unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
              *)&local_128,(object *)&local_68._M_first,
             (unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
              *)local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<double,std::hash<double>,std::equal_to<double>,std::allocator<double>>,std::unordered_set<double,std::hash<double>,std::equal_to<double>,std::allocator<double>>>
            ((internal *)local_138,"obj .get< std::unordered_set<double> >()",
             "std::unordered_set<double> {}",
             (unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
              *)&local_128,
             (unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
              *)&local_a8);
  std::
  _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<long_double,true,true>,std::__detail::_Node_iterator<long_double,true,true>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<long_double,_true,_true> *)local_e8,
             (_Node_iterator<long_double,_true,_true> *)&local_a8);
  std::
  _Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,
               "obj .has< std::unordered_set<long double> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30f,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_std::unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_nullptr>
            ((unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
              *)&local_128,(object *)&local_68._M_first,
             (unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
              *)local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<long_double,std::hash<long_double>,std::equal_to<long_double>,std::allocator<long_double>>,std::unordered_set<long_double,std::hash<long_double>,std::equal_to<long_double>,std::allocator<long_double>>>
            ((internal *)local_138,"obj .get< std::unordered_set<long double> >()",
             "std::unordered_set<long double> {}",
             (unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
              *)&local_128,
             (unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
              *)&local_a8);
  std::
  _Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x30f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<std::__cxx11::u8string,true,true>,std::__detail::_Node_iterator<std::__cxx11::u8string,true,true>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,
             (_Node_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_true,_true>
              *)local_e8,
             (_Node_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_true,_true>
              *)&local_a8);
  std::
  _Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,
               "obj .has< std::unordered_set<std::u8string> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x310,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_128,(object *)&local_68._M_first,
             (unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<std::__cxx11::u8string,std::hash<std::__cxx11::u8string>,std::equal_to<std::__cxx11::u8string>,std::allocator<std::__cxx11::u8string>>,std::unordered_set<std::__cxx11::u8string,std::hash<std::__cxx11::u8string>,std::equal_to<std::__cxx11::u8string>,std::allocator<std::__cxx11::u8string>>>
            ((internal *)local_138,"obj .get< std::unordered_set<std::u8string> >()",
             "std::unordered_set<std::u8string> {}",
             (unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_128,
             (unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_a8);
  std::
  _Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x310,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_bucket_count = 1;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  local_128._M_buckets = pp_Var1;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::__detail::_Node_iterator<jessilib::object,true,false>,std::__detail::_Node_iterator<jessilib::object,true,false>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_68._M_first,(_Node_iterator<jessilib::object,_true,_false> *)local_e8,
             (_Node_iterator<jessilib::object,_true,_false> *)&local_a8);
  std::
  _Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  local_e8[0] = local_38 == '\x06';
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != '\x06') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_128,local_e8,"obj .has< std::unordered_set<object> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x311,(char *)local_128._M_buckets);
    testing::internal::AssertHelper::operator=(local_138,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    if ((__node_base *)local_128._M_buckets != &local_128._M_before_begin) {
      operator_delete(local_128._M_buckets,
                      (ulong)((long)&(local_128._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_a8._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
    }
  }
  if (pbStack_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_e0,pbStack_e0);
  }
  local_d8._M_nxt = (_Hash_node_base *)0x0;
  sStack_d0 = 0;
  pbStack_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_c8._M_max_load_factor = 1.0;
  local_c8._4_4_ = 0;
  local_c8._M_next_resize = 0;
  local_b8[0] = (__node_base_ptr)0x0;
  local_e8 = (undefined1  [8])local_b8;
  jessilib::object::
  get<std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            ((unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&local_128,(object *)&local_68._M_first,
             (unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
              *)local_e8);
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_a8._M_buckets = pp_Var2;
  testing::internal::
  CmpHelperEQ<std::unordered_set<jessilib::object,std::hash<jessilib::object>,std::equal_to<jessilib::object>,std::allocator<jessilib::object>>,std::unordered_set<jessilib::object,std::hash<jessilib::object>,std::equal_to<jessilib::object>,std::allocator<jessilib::object>>>
            ((internal *)local_138,"obj .get< std::unordered_set<object> >()",
             "std::unordered_set<object> {}",
             (unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&local_128,
             (unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&local_a8);
  std::
  _Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_a8);
  std::
  _Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_128);
  std::
  _Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e8);
  if (local_138[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x311,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_128._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_128._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_68._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_assignment_operator_unordered_set) {
	object obj;

	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<bool>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<signed char>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<unsigned char>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<short>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<int>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<long>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<long long>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<intmax_t>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<float>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<double>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<long double>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<std::u8string>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<object>);
}